

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

el_status_t exchange(void)

{
  int iVar1;
  int iVar2;
  undefined4 local_14;
  undefined4 local_c;
  int c;
  
  iVar2 = tty_get();
  iVar1 = rl_mark;
  if (iVar2 == 0x18) {
    if (rl_end < rl_mark) {
      local_c = CSstay;
    }
    else {
      rl_mark = rl_point;
      rl_point = iVar1;
      local_c = CSmove;
    }
  }
  else {
    if (iVar2 == -1) {
      local_14 = CSeof;
    }
    else {
      local_14 = el_ring_bell();
    }
    local_c = local_14;
  }
  return local_c;
}

Assistant:

static el_status_t exchange(void)
{
    int c;

    if ((c = tty_get()) != CTL('X'))
        return c == EOF ? CSeof : el_ring_bell();

    if ((c = rl_mark) <= rl_end) {
        rl_mark = rl_point;
        rl_point = c;
        return CSmove;
    }

    return CSstay;
}